

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O2

int __thiscall QuantizeData::update_histogram(QuantizeData *this,Mat *data)

{
  float fVar1;
  pointer pfVar2;
  void *pvVar3;
  int i;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int _c;
  Mat local_70;
  
  uVar7 = data->h * data->w;
  uVar4 = 0;
  uVar8 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar8 = uVar4;
  }
  iVar6 = data->c;
  if (data->c < 1) {
    iVar6 = 0;
  }
  while (_c = (int)uVar4, _c != iVar6) {
    ncnn::Mat::channel(&local_70,data,_c);
    pvVar3 = local_70.data;
    ncnn::Mat::~Mat(&local_70);
    pfVar2 = (this->histogram).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
      fVar1 = *(float *)((long)pvVar3 + uVar4 * 4);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        iVar5 = (int)(ABS(fVar1) / this->histogram_interval);
        if (0x7fe < iVar5) {
          iVar5 = 0x7ff;
        }
        pfVar2[iVar5] = pfVar2[iVar5] + 1.0;
      }
    }
    uVar4 = (ulong)(_c + 1);
  }
  return 0;
}

Assistant:

int QuantizeData::update_histogram(ncnn::Mat data)
{
    int channel_num = data.c;
    int size = data.w * data.h;

    for (int q=0; q<channel_num; q++)
    {
        const float *data_n = data.channel(q);
        for(int i=0; i<size; i++)
        {
            if (data_n[i] == 0)
                continue;

            int index = std::min(static_cast<int>(std::abs(data_n[i]) / histogram_interval), 2047);

            histogram[index]++;
        }
    }        

    return 0;
}